

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteHelpRule
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  _Base_ptr *pp_Var1;
  pointer puVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  pointer puVar4;
  pointer pbVar5;
  bool bVar6;
  TargetType TVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  _Base_ptr p_Var8;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar9;
  string *o;
  pointer pbVar10;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  pointer puVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string local_188;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_120;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  project_targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  globals_targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  utility_targets;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var1 = &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,
             "The following are some of the valid targets for this Makefile:","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,"... all (the default if no target is provided)","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... clean","");
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&emittedTargets,"CMAKE_SUPPRESS_REGENERATION","");
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&emittedTargets);
  if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                    (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (!bVar6) {
    emittedTargets._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&emittedTargets,"... depend","");
    cmLocalUnixMakefileGenerator3::AppendEcho
              (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
    if ((_Base_ptr *)emittedTargets._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)emittedTargets._M_t._M_impl._0_8_,
                      (ulong)((long)&(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &utility_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &globals_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &project_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar9 != puVar2) {
    do {
      pcVar3 = (cmLocalUnixMakefileGenerator3 *)
               (puVar9->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      if ((pcVar3 == lg) ||
         (bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg), bVar6)) {
        puVar4 = *(pointer *)
                  &((GeneratorTargetVector *)((long)&pcVar3->super_cmLocalCommonGenerator + 0x150))
                   ->
                   super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
        ;
        for (puVar11 = *(pointer *)
                        &((GeneratorTargetVector *)
                         ((long)&pcVar3->super_cmLocalCommonGenerator + 0x148))->
                         super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ; puVar11 != puVar4; puVar11 = puVar11 + 1) {
          TVar7 = cmGeneratorTarget::GetType
                            ((puVar11->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (TVar7 < UTILITY) {
LAB_003999d3:
            __v = cmGeneratorTarget::GetName_abi_cxx11_
                            ((puVar11->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&project_targets;
LAB_003999df:
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>(this_00,__v);
          }
          else {
            if (TVar7 == UTILITY) {
              __v = cmGeneratorTarget::GetName_abi_cxx11_
                              ((puVar11->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
              this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&utility_targets;
              goto LAB_003999df;
            }
            if (TVar7 == GLOBAL_TARGET) {
              __v = cmGeneratorTarget::GetName_abi_cxx11_
                              ((puVar11->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
              this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&globals_targets;
              goto LAB_003999df;
            }
            if ((TVar7 == INTERFACE_LIBRARY) &&
               (bVar6 = cmGeneratorTarget::IsInBuildSystem
                                  ((puVar11->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl),
               bVar6)) goto LAB_003999d3;
          }
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
    if ((_Rb_tree_header *)globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &globals_targets._M_t._M_impl.super__Rb_tree_header) {
      p_Var8 = globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_188.field_2._8_8_ = *(undefined8 *)(p_Var8 + 1);
        local_188.field_2._M_allocated_capacity = (size_type)p_Var8[1]._M_parent;
        local_188._M_dataplus._M_p = (pointer)0x4;
        local_188._M_string_length = 0x6ace72;
        views._M_len = 2;
        views._M_array = (iterator)&local_188;
        cmCatViews_abi_cxx11_(&local_120,views);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &globals_targets._M_t._M_impl.super__Rb_tree_header);
    }
  }
  if ((_Rb_tree_header *)utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &utility_targets._M_t._M_impl.super__Rb_tree_header) {
    p_Var8 = utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_188.field_2._8_8_ = *(undefined8 *)(p_Var8 + 1);
      local_188.field_2._M_allocated_capacity = (size_type)p_Var8[1]._M_parent;
      local_188._M_dataplus._M_p = (pointer)0x4;
      local_188._M_string_length = 0x6ace72;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_188;
      cmCatViews_abi_cxx11_(&local_120,views_00);
      std::__cxx11::string::operator=((string *)&path,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &utility_targets._M_t._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_header *)project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &project_targets._M_t._M_impl.super__Rb_tree_header) {
    p_Var8 = project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_188.field_2._8_8_ = *(undefined8 *)(p_Var8 + 1);
      local_188.field_2._M_allocated_capacity = (size_type)p_Var8[1]._M_parent;
      local_188._M_dataplus._M_p = (pointer)0x4;
      local_188._M_string_length = 0x6ace72;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_188;
      cmCatViews_abi_cxx11_(&local_120,views_01);
      std::__cxx11::string::operator=((string *)&path,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &project_targets._M_t._M_impl.super__Rb_tree_header);
  }
  pbVar10 = (lg->LocalHelp).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (lg->LocalHelp).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar5) {
    do {
      local_188.field_2._8_8_ = (pbVar10->_M_dataplus)._M_p;
      local_188.field_2._M_allocated_capacity = pbVar10->_M_string_length;
      local_188._M_dataplus._M_p = (pointer)0x4;
      local_188._M_string_length = 0x6ace72;
      views_02._M_len = 2;
      views_02._M_array = (iterator)&local_188;
      cmCatViews_abi_cxx11_(&local_120,views_02);
      std::__cxx11::string::operator=((string *)&path,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar5);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"help","");
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (lg,ruleFileStream,"Help Target",&local_188,&no_depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,(ulong)(local_188.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n\n",2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&project_targets._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&globals_targets._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&utility_targets._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedTargets._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,
                    CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteHelpRule(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // add the help target
  std::string path;
  std::vector<std::string> no_depends;
  std::vector<std::string> commands;
  lg->AppendEcho(commands,
                 "The following are some of the valid targets "
                 "for this Makefile:");
  lg->AppendEcho(commands, "... all (the default if no target is provided)");
  lg->AppendEcho(commands, "... clean");
  if (!this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    lg->AppendEcho(commands, "... depend");
  }

  // Keep track of targets already listed.
  std::set<std::string> emittedTargets;
  std::set<std::string> utility_targets;
  std::set<std::string> globals_targets;
  std::set<std::string> project_targets;

  // for each local generator
  for (const auto& localGen : this->LocalGenerators) {
    const auto& lg2 =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen);
    // for the passed in makefile or if this is the top Makefile wripte out
    // the targets
    if (&lg2 == lg || lg->IsRootMakefile()) {
      // for each target Generate the rule files for each target.
      for (const auto& target : lg2.GetGeneratorTargets()) {
        cmStateEnums::TargetType type = target->GetType();
        if ((type == cmStateEnums::EXECUTABLE) ||
            (type == cmStateEnums::STATIC_LIBRARY) ||
            (type == cmStateEnums::SHARED_LIBRARY) ||
            (type == cmStateEnums::MODULE_LIBRARY) ||
            (type == cmStateEnums::OBJECT_LIBRARY) ||
            (type == cmStateEnums::INTERFACE_LIBRARY &&
             target->IsInBuildSystem())) {
          project_targets.insert(target->GetName());
        } else if (type == cmStateEnums::GLOBAL_TARGET) {
          globals_targets.insert(target->GetName());
        } else if (type == cmStateEnums::UTILITY) {
          utility_targets.insert(target->GetName());
        }
      }
    }
  }

  for (std::string const& name : globals_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }
  for (std::string const& name : utility_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }
  for (std::string const& name : project_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }

  for (std::string const& o : lg->GetLocalHelp()) {
    path = cmStrCat("... ", o);
    lg->AppendEcho(commands, path);
  }
  lg->WriteMakeRule(ruleFileStream, "Help Target", "help", no_depends,
                    commands, true);
  ruleFileStream << "\n\n";
}